

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_init_sc_decisions(AV1_PRIMARY *ppi)

{
  int iVar1;
  AV1_COMP *pAVar2;
  AV1_COMP *pAVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = ppi->num_fp_contexts;
  if (1 < (long)iVar1) {
    pAVar2 = ppi->cpi;
    lVar5 = 1;
    do {
      pAVar3 = ppi->parallel_cpi[lVar5];
      (pAVar3->common).features.allow_screen_content_tools =
           (pAVar2->common).features.allow_screen_content_tools;
      (pAVar3->common).features.allow_intrabc = (pAVar2->common).features.allow_intrabc;
      iVar4 = pAVar2->is_screen_content_type;
      pAVar3->use_screen_content_tools = pAVar2->use_screen_content_tools;
      pAVar3->is_screen_content_type = iVar4;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return;
}

Assistant:

void av1_init_sc_decisions(AV1_PRIMARY *const ppi) {
  AV1_COMP *const first_cpi = ppi->cpi;
  for (int i = 1; i < ppi->num_fp_contexts; ++i) {
    AV1_COMP *cur_cpi = ppi->parallel_cpi[i];
    cur_cpi->common.features.allow_screen_content_tools =
        first_cpi->common.features.allow_screen_content_tools;
    cur_cpi->common.features.allow_intrabc =
        first_cpi->common.features.allow_intrabc;
    cur_cpi->use_screen_content_tools = first_cpi->use_screen_content_tools;
    cur_cpi->is_screen_content_type = first_cpi->is_screen_content_type;
  }
}